

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_std_urlGet(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  undefined1 auVar3 [16];
  JSContext *ctx_00;
  int iVar4;
  int iVar5;
  char *__s;
  size_t sVar6;
  FILE *__stream;
  uint8_t *data;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  DynBuf *pDVar7;
  ulong uVar8;
  DynBuf *buf_size;
  uint8_t *__nptr;
  size_t sVar9;
  JSValue v;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue val;
  JSValueUnion local_f0;
  BOOL full_flag;
  ulong local_e0;
  int local_d8;
  BOOL binary_flag;
  undefined8 local_d0;
  JSContext *local_c8;
  DynBuf header_buf_s;
  DynBuf data_buf_s;
  DynBuf cmd_buf;
  
  pDVar7 = (DynBuf *)CONCAT44(in_register_0000000c,argc);
  __s = JS_ToCString(ctx,*argv);
  if (__s == (char *)0x0) {
LAB_0010ea96:
    JVar11 = (JSValue)(ZEXT816(6) << 0x40);
    uVar8 = 0;
    goto LAB_0010eb5d;
  }
  binary_flag = 0;
  full_flag = 0;
  if (1 < argc) {
    pDVar7 = (DynBuf *)argv[1].tag;
    JVar11 = argv[1];
    iVar4 = get_bool_option(ctx,&binary_flag,argv[1],"binary");
    if ((iVar4 != 0) || (iVar4 = get_bool_option(ctx,&full_flag,JVar11,"full"), iVar4 != 0)) {
      JS_FreeCString(ctx,__s);
      goto LAB_0010ea96;
    }
  }
  local_c8 = ctx;
  js_std_dbuf_init(ctx,&cmd_buf);
  dbuf_printf(&cmd_buf,"%s \'\'","curl -s -i");
  sVar6 = strlen(__s);
  buf_size = (DynBuf *)0x5c;
  for (sVar9 = 0; ctx_00 = local_c8, sVar6 != sVar9; sVar9 = sVar9 + 1) {
    uVar2 = __s[sVar9];
    if ((uVar2 == '\\') || (uVar2 == '\'')) {
      dbuf_putc(&cmd_buf,'\\');
    }
    dbuf_putc(&cmd_buf,uVar2);
  }
  JS_FreeCString(local_c8,__s);
  dbuf_putstr(&cmd_buf,"\'\'");
  dbuf_putc(&cmd_buf,'\0');
  if (cmd_buf.error == 0) {
    __stream = popen((char *)cmd_buf.buf,"r");
    dbuf_free(&cmd_buf);
    if (__stream == (FILE *)0x0) {
      JVar11 = JS_ThrowTypeError(ctx_00,"could not start curl");
      uVar8 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
      goto LAB_0010eb5d;
    }
    js_std_dbuf_init(ctx_00,&data_buf_s);
    js_std_dbuf_init(ctx_00,&header_buf_s);
    data = (uint8_t *)js_malloc(ctx_00,0x1000);
    if (data == (uint8_t *)0x0) goto LAB_0010ec3f;
    iVar4 = http_get_header_line((FILE *)__stream,(char *)data,0,pDVar7);
    __nptr = data;
    if (-1 < iVar4) {
      for (; uVar2 = *__nptr, uVar2 != '\0'; __nptr = __nptr + 1) {
        if (uVar2 == ' ') goto LAB_0010ec01;
      }
      local_d0 = 0;
      goto LAB_0010ec86;
    }
    JVar12 = (JSValue)(ZEXT816(2) << 0x40);
    local_d0 = 0;
    iVar4 = full_flag;
    goto LAB_0010ecfd;
  }
  dbuf_free(&cmd_buf);
  goto LAB_0010eb54;
LAB_0010ec01:
  while (uVar2 == ' ') {
    puVar1 = __nptr + 1;
    __nptr = __nptr + 1;
    uVar2 = *puVar1;
  }
  iVar4 = atoi((char *)__nptr);
  local_d0 = CONCAT44(extraout_var,iVar4);
LAB_0010ec86:
  pDVar7 = (DynBuf *)(ulong)(uint)full_flag;
  local_e0 = 2;
  JVar12 = (JSValue)(ZEXT816(2) << 0x40);
  if ((full_flag == 0) && (99 < (int)local_d0 - 200U)) {
    iVar4 = 0;
LAB_0010ecfd:
    local_e0 = JVar12.tag;
    local_f0 = JVar12.u;
    js_free(ctx_00,data);
    pclose(__stream);
    dbuf_free(&data_buf_s);
    if (iVar4 == 0) {
      JVar11.tag = local_e0;
      JVar11.u.ptr = (void *)((ulong)local_f0.ptr & 0xffffffff | (long)buf_size << 0x20);
    }
    else {
      JVar11 = JS_NewObject(ctx_00);
      uVar8 = local_e0;
      JVar12.tag = local_e0;
      JVar12.u.ptr = local_f0.ptr;
      if ((int)JVar11.tag == 6) {
        pDVar7 = (DynBuf *)0x0;
        data = (uint8_t *)0x0;
        goto LAB_0010ed39;
      }
      val.u.ptr = (void *)((ulong)local_f0.ptr & 0xffffffff | (long)buf_size << 0x20);
      val.tag = local_e0;
      JS_DefinePropertyValueStr(ctx_00,JVar11,"response",val,7);
      if ((int)uVar8 != 2) {
        JVar12 = JS_NewStringLen(ctx_00,(char *)header_buf_s.buf,header_buf_s.size);
        JS_DefinePropertyValueStr(ctx_00,JVar11,"responseHeaders",JVar12,7);
        JS_DefinePropertyValueStr(ctx_00,JVar11,"status",(JSValue)ZEXT416((uint)local_d0),7);
      }
    }
    dbuf_free(&header_buf_s);
    uVar8 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
    goto LAB_0010eb5d;
  }
  local_d8 = full_flag;
  buf_size = &header_buf_s;
  do {
    iVar5 = http_get_header_line((FILE *)__stream,(char *)data,(size_t)buf_size,pDVar7);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_e0;
    JVar12 = (JSValue)(auVar3 << 0x40);
    iVar4 = local_d8;
    if (iVar5 < 0) goto LAB_0010ecfd;
  } while (((*data != '\r') || (data[1] != '\n')) || (data[2] != '\0'));
  buf_size = (DynBuf *)0x0;
  if (header_buf_s.error == 0) {
    header_buf_s.size = header_buf_s.size - 2;
    while (sVar6 = fread(data,1,0x1000,__stream), sVar6 != 0) {
      dbuf_put(&data_buf_s,data,sVar6);
    }
    JVar12 = (JSValue)(ZEXT816(3) << 0x40);
    if (data_buf_s.error == 0) {
      if (binary_flag == 0) {
        JVar12 = JS_NewStringLen(ctx_00,(char *)data_buf_s.buf,data_buf_s.size);
      }
      else {
        JVar12 = JS_NewArrayBufferCopy(ctx_00,data_buf_s.buf,data_buf_s.size);
      }
      local_e0 = JVar12.tag;
      buf_size = (DynBuf *)((ulong)JVar12.u.ptr >> 0x20);
      iVar4 = local_d8;
      if ((int)JVar12.tag != 6) goto LAB_0010ecfd;
    }
  }
  else {
LAB_0010ec3f:
    buf_size = (DynBuf *)0x0;
    JVar12 = (JSValue)(ZEXT816(3) << 0x40);
  }
  pclose(__stream);
  pDVar7 = &data_buf_s;
LAB_0010ed39:
  local_f0 = JVar12.u;
  js_free(ctx_00,data);
  if (pDVar7 != (DynBuf *)0x0) {
    dbuf_free(pDVar7);
  }
  dbuf_free(&header_buf_s);
  v.u.ptr = (void *)((ulong)local_f0.ptr & 0xffffffff | (long)buf_size << 0x20);
  v.tag = JVar12.tag;
  JS_FreeValue(ctx_00,v);
LAB_0010eb54:
  uVar8 = 0;
  JVar11 = (JSValue)(ZEXT816(6) << 0x40);
LAB_0010eb5d:
  JVar10.u.ptr = (void *)((ulong)JVar11.u.ptr & 0xffffffff | uVar8);
  JVar10.tag = JVar11.tag;
  return JVar10;
}

Assistant:

static JSValue js_std_urlGet(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *url;
    DynBuf cmd_buf;
    DynBuf data_buf_s, *data_buf = &data_buf_s;
    DynBuf header_buf_s, *header_buf = &header_buf_s;
    char *buf; 
    size_t i, len;
    int c, status;
    JSValue response = JS_UNDEFINED, ret_obj;
    JSValueConst options_obj;
    FILE *f;
    BOOL binary_flag, full_flag;
    
    url = JS_ToCString(ctx, argv[0]);
    if (!url)
        return JS_EXCEPTION;
    
    binary_flag = FALSE;
    full_flag = FALSE;
    
    if (argc >= 2) {
        options_obj = argv[1];

        if (get_bool_option(ctx, &binary_flag, options_obj, "binary"))
            goto fail_obj;

        if (get_bool_option(ctx, &full_flag, options_obj, "full")) {
        fail_obj:
            JS_FreeCString(ctx, url);
            return JS_EXCEPTION;
        }
    }
    
    js_std_dbuf_init(ctx, &cmd_buf);
    dbuf_printf(&cmd_buf, "%s ''", URL_GET_PROGRAM);
    len = strlen(url);
    for(i = 0; i < len; i++) {
        c = url[i];
        if (c == '\'' || c == '\\')
            dbuf_putc(&cmd_buf, '\\');
        dbuf_putc(&cmd_buf, c);
    }
    JS_FreeCString(ctx, url);
    dbuf_putstr(&cmd_buf, "''");
    dbuf_putc(&cmd_buf, '\0');
    if (dbuf_error(&cmd_buf)) {
        dbuf_free(&cmd_buf);
        return JS_EXCEPTION;
    }
    //    printf("%s\n", (char *)cmd_buf.buf);
    f = popen((char *)cmd_buf.buf, "r");
    dbuf_free(&cmd_buf);
    if (!f) {
        return JS_ThrowTypeError(ctx, "could not start curl");
    }

    js_std_dbuf_init(ctx, data_buf);
    js_std_dbuf_init(ctx, header_buf);
    
    buf = js_malloc(ctx, URL_GET_BUF_SIZE);
    if (!buf)
        goto fail;

    /* get the HTTP status */
    if (http_get_header_line(f, buf, URL_GET_BUF_SIZE, NULL) < 0) {
        status = 0;
        goto bad_header;
    }
    status = http_get_status(buf);
    if (!full_flag && !(status >= 200 && status <= 299)) {
        goto bad_header;
    }
    
    /* wait until there is an empty line */
    for(;;) {
        if (http_get_header_line(f, buf, URL_GET_BUF_SIZE, header_buf) < 0) {
        bad_header:
            response = JS_NULL;
            goto done;
        }
        if (!strcmp(buf, "\r\n"))
            break;
    }
    if (dbuf_error(header_buf))
        goto fail;
    header_buf->size -= 2; /* remove the trailing CRLF */

    /* download the data */
    for(;;) {
        len = fread(buf, 1, URL_GET_BUF_SIZE, f);
        if (len == 0)
            break;
        dbuf_put(data_buf, (uint8_t *)buf, len);
    }
    if (dbuf_error(data_buf))
        goto fail;
    if (binary_flag) {
        response = JS_NewArrayBufferCopy(ctx,
                                         data_buf->buf, data_buf->size);
    } else {
        response = JS_NewStringLen(ctx, (char *)data_buf->buf, data_buf->size);
    }
    if (JS_IsException(response))
        goto fail;
 done:
    js_free(ctx, buf);
    buf = NULL;
    pclose(f);
    f = NULL;
    dbuf_free(data_buf);
    data_buf = NULL;

    if (full_flag) {
        ret_obj = JS_NewObject(ctx);
        if (JS_IsException(ret_obj))
            goto fail;
        JS_DefinePropertyValueStr(ctx, ret_obj, "response",
                                  response,
                                  JS_PROP_C_W_E);
        if (!JS_IsNull(response)) {
            JS_DefinePropertyValueStr(ctx, ret_obj, "responseHeaders",
                                      JS_NewStringLen(ctx, (char *)header_buf->buf,
                                                      header_buf->size),
                                      JS_PROP_C_W_E);
            JS_DefinePropertyValueStr(ctx, ret_obj, "status",
                                      JS_NewInt32(ctx, status),
                                      JS_PROP_C_W_E);
        }
    } else {
        ret_obj = response;
    }
    dbuf_free(header_buf);
    return ret_obj;
 fail:
    if (f)
        pclose(f);
    js_free(ctx, buf);
    if (data_buf)
        dbuf_free(data_buf);
    if (header_buf)
        dbuf_free(header_buf);
    JS_FreeValue(ctx, response);
    return JS_EXCEPTION;
}